

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckedArithmetic.h
# Opt level: O0

unsigned_long Imf_2_5::uiMult<unsigned_long>(unsigned_long a,unsigned_long b)

{
  unsigned_long uVar1;
  OverflowExc *this;
  ulong in_RSI;
  ulong in_RDI;
  StaticAssertionFailed<true> staticAssertionFailed;
  
  if (in_RDI != 0) {
    uVar1 = std::numeric_limits<unsigned_long>::max();
    if (uVar1 / in_RDI < in_RSI) {
      this = (OverflowExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::OverflowExc::OverflowExc(this,"Integer multiplication overflow.");
      __cxa_throw(this,&Iex_2_5::OverflowExc::typeinfo,Iex_2_5::OverflowExc::~OverflowExc);
    }
  }
  return in_RDI * in_RSI;
}

Assistant:

T
uiMult (T a, T b)
{
    //
    // Unsigned integer multiplication
    //

    IMF_STATIC_ASSERT (!std::numeric_limits<T>::is_signed &&
                        std::numeric_limits<T>::is_integer);

    if (a > 0 && b > std::numeric_limits<T>::max() / a)
        throw IEX_NAMESPACE::OverflowExc ("Integer multiplication overflow.");

    return a * b;
}